

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR buf_store_char(lysp_yang_ctx *ctx,yang_arg arg,char **word_p,size_t *word_len,char **word_b,
                     size_t *buf_len,ly_bool need_buf,uint8_t *prefix)

{
  char **ppcVar1;
  ly_in *plVar2;
  size_t sVar3;
  size_t __size;
  LY_ERR LVar4;
  char *__dest;
  uint64_t *puVar5;
  ly_ctx *plVar6;
  size_t len;
  size_t local_48;
  char **local_40;
  uint32_t local_34;
  
  local_40 = word_p;
  if (word_b == (char **)0x0 && need_buf != '\0') {
    __assert_fail("!need_buf || (need_buf && word_b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                  ,0xae,
                  "LY_ERR buf_store_char(struct lysp_yang_ctx *, enum yang_arg, char **, size_t *, char **, size_t *, ly_bool, uint8_t *)"
                 );
  }
  LVar4 = ly_getutf8(&ctx->in->current,&local_34,&local_48);
  if (LVar4 != LY_SUCCESS) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
            (ulong)(uint)(int)ctx->in->current[-local_48]);
    return LY_EVALID;
  }
  plVar2 = ctx->in;
  ppcVar1 = &plVar2->current;
  *ppcVar1 = *ppcVar1 + -local_48;
  puVar5 = &ctx->indent;
  if (local_34 == 10) {
    *puVar5 = 0;
    puVar5 = &plVar2->line;
  }
  *puVar5 = *puVar5 + 1;
  if (arg - Y_STR_ARG < 2) {
    LVar4 = lysp_check_stringchar((lysp_ctx *)ctx,local_34);
  }
  else {
    if (arg == Y_PREF_IDENTIF_ARG) {
      sVar3 = *word_len;
    }
    else {
      if (arg != Y_IDENTIF_ARG) goto LAB_00173090;
      sVar3 = *word_len;
      prefix = (uint8_t *)0x0;
    }
    LVar4 = lysp_check_identifierchar((lysp_ctx *)ctx,local_34,sVar3 == 0,prefix);
  }
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
LAB_00173090:
  if ((word_b == (char **)0x0) || (*word_b == (char *)0x0)) {
    if (need_buf == '\0' || word_b == (char **)0x0) {
      if (*local_40 == (char *)0x0) {
        *local_40 = ctx->in->current;
      }
      *word_len = *word_len + local_48;
      ly_in_skip(ctx->in,local_48);
      return LY_SUCCESS;
    }
    __size = *word_len;
    if (__size != 0) {
      __dest = (char *)malloc(__size);
      *word_b = __dest;
      if (__dest == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","buf_store_char");
        return LY_EMEM;
      }
      *buf_len = __size;
      memcpy(__dest,*local_40,*word_len);
    }
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar6 = (ly_ctx *)0x0;
  }
  else {
    plVar6 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar4 = buf_add_char(plVar6,ctx->in,local_48,word_b,buf_len,word_len);
  if (LVar4 == LY_SUCCESS) {
    *local_40 = *word_b;
    return LY_SUCCESS;
  }
  return LY_EMEM;
}

Assistant:

LY_ERR
buf_store_char(struct lysp_yang_ctx *ctx, enum yang_arg arg, char **word_p, size_t *word_len,
        char **word_b, size_t *buf_len, ly_bool need_buf, uint8_t *prefix)
{
    uint32_t c;
    size_t len;

    /* check  valid combination of input paremeters - if need_buf specified, word_b must be provided */
    assert(!need_buf || (need_buf && word_b));

    /* get UTF8 code point (and number of bytes coding the character) */
    LY_CHECK_ERR_RET(ly_getutf8(&ctx->in->current, &c, &len),
            LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, ctx->in->current[-len]), LY_EVALID);
    ctx->in->current -= len;
    if (c == '\n') {
        ctx->indent = 0;
        LY_IN_NEW_LINE(ctx->in);
    } else {
        /* note - even the multibyte character is count as 1 */
        ++ctx->indent;
    }

    /* check character validity */
    switch (arg) {
    case Y_IDENTIF_ARG:
        LY_CHECK_RET(lysp_check_identifierchar((struct lysp_ctx *)ctx, c, !(*word_len), NULL));
        break;
    case Y_PREF_IDENTIF_ARG:
        LY_CHECK_RET(lysp_check_identifierchar((struct lysp_ctx *)ctx, c, !(*word_len), prefix));
        break;
    case Y_STR_ARG:
    case Y_MAYBE_STR_ARG:
        LY_CHECK_RET(lysp_check_stringchar((struct lysp_ctx *)ctx, c));
        break;
    }

    if (word_b && *word_b) {
        /* add another character into buffer */
        if (buf_add_char(PARSER_CTX(ctx), ctx->in, len, word_b, buf_len, word_len)) {
            return LY_EMEM;
        }

        /* in case of realloc */
        *word_p = *word_b;
    } else if (word_b && need_buf) {
        /* first time we need a buffer, copy everything read up to now */
        if (*word_len) {
            *word_b = malloc(*word_len);
            LY_CHECK_ERR_RET(!*word_b, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
            *buf_len = *word_len;
            memcpy(*word_b, *word_p, *word_len);
        }

        /* add this new character into buffer */
        if (buf_add_char(PARSER_CTX(ctx), ctx->in, len, word_b, buf_len, word_len)) {
            return LY_EMEM;
        }

        /* in case of realloc */
        *word_p = *word_b;
    } else {
        /* just remember the first character pointer */
        if (!*word_p) {
            *word_p = (char *)ctx->in->current;
        }
        /* ... and update the word's length */
        (*word_len) += len;
        ly_in_skip(ctx->in, len);
    }

    return LY_SUCCESS;
}